

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

Color __thiscall Color::desaturate(Color *this,double factor)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint8_t rounded_b;
  double b;
  uint8_t rounded_g;
  double g;
  uint8_t rounded_r;
  double r;
  double gray_equivalent;
  double factor_local;
  Color *this_local;
  
  dVar1 = (double)((uint)this->_r + (uint)this->_g + (uint)this->_b) / 3.0;
  dVar2 = round((double)this->_r * (1.0 - factor) + dVar1 * factor);
  dVar3 = round((double)this->_g * (1.0 - factor) + dVar1 * factor);
  dVar1 = round((double)this->_b * (1.0 - factor) + dVar1 * factor);
  Color((Color *)((long)&this_local + 4),(uint8_t)(int)dVar2,(uint8_t)(int)dVar3,(uint8_t)(int)dVar1
       );
  return this_local._4_4_;
}

Assistant:

Color Color::desaturate(double factor) const
{
    double gray_equivalent = (_r + _g + _b) / 3.0;

    double r = (_r * (1-factor)) + (gray_equivalent * factor);
    uint8_t rounded_r = (uint8_t)std::round(r);

    double g = (_g * (1-factor)) + (gray_equivalent * factor);
    uint8_t rounded_g = (uint8_t)std::round(g);

    double b = (_b * (1-factor)) + (gray_equivalent * factor);
    uint8_t rounded_b = (uint8_t)std::round(b);

    return { rounded_r, rounded_g, rounded_b };
}